

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::MembraneHook::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,MembraneHook *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,CallHints hints
          )

{
  ushort uVar1;
  uint64_t uVar2;
  uint uVar3;
  ClientHook *pCVar4;
  MembranePolicy *pMVar5;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  aVar6;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *other;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pPVar7;
  Client *pCVar8;
  RefOrVoid<capnp::MembranePolicy> policy;
  Maybe<capnp::MessageSize> local_1e0;
  Request<capnp::AnyPointer,_capnp::AnyPointer> local_1c8;
  CallHints local_19a;
  Maybe<capnp::MessageSize> local_198;
  Client local_180;
  ClientHook local_170;
  uint local_160;
  CallHints local_15a;
  Maybe<capnp::MessageSize> local_158;
  undefined1 local_140 [16];
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_130;
  Own<capnp::ClientHook,_std::nullptr_t> local_128;
  ClientHook *local_118;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *p;
  undefined1 local_100 [8];
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _p425;
  Client *r_1;
  Client *_r419;
  Own<capnp::ClientHook,_std::nullptr_t> local_d8;
  Client local_c8;
  byte local_b2;
  byte local_b1;
  Own<capnp::ClientHook,_std::nullptr_t> local_b0;
  Client local_a0;
  undefined1 local_90 [8];
  Maybe<capnp::Capability::Client> redirect;
  Maybe<capnp::MessageSize> local_60;
  Own<capnp::ClientHook,_std::nullptr_t> *local_48;
  Own<capnp::ClientHook,_std::nullptr_t> *r;
  Own<capnp::ClientHook,_std::nullptr_t> *_r412;
  Maybe<capnp::MessageSize> *sizeHint_local;
  uint64_t uStack_28;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  MembraneHook *this_local;
  Request<capnp::AnyPointer,_capnp::AnyPointer> *pRStack_10;
  CallHints hints_local;
  
  _r412 = (Own<capnp::ClientHook,_std::nullptr_t> *)sizeHint;
  sizeHint_local._6_2_ = methodId;
  uStack_28 = interfaceId;
  interfaceId_local = (uint64_t)this;
  this_local._6_2_ = hints;
  pRStack_10 = __return_storage_ptr__;
  local_48 = kj::_::readMaybe<capnp::ClientHook,decltype(nullptr)>(&this->resolved);
  r = local_48;
  if (local_48 != (Own<capnp::ClientHook,_std::nullptr_t> *)0x0) {
    pCVar4 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(local_48);
    uVar2 = uStack_28;
    uVar1 = sizeHint_local._6_2_;
    kj::Maybe<capnp::MessageSize>::Maybe(&local_60,sizeHint);
    (**pCVar4->_vptr_ClientHook)
              (__return_storage_ptr__,pCVar4,uVar2,(ulong)uVar1,&local_60,
               (ulong)(ushort)this_local._6_2_);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_60);
    return __return_storage_ptr__;
  }
  local_b1 = 0;
  local_b2 = 0;
  if ((this->reverse & 1U) == 0) {
    pMVar5 = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator->(&this->policy);
    uVar2 = uStack_28;
    uVar1 = sizeHint_local._6_2_;
    pCVar4 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(&this->inner);
    (*pCVar4->_vptr_ClientHook[4])(&local_d8);
    Capability::Client::Client(&local_c8,&local_d8);
    (**pMVar5->_vptr_MembranePolicy)(local_90,pMVar5,uVar2,(ulong)uVar1,&local_c8);
    Capability::Client::~Client(&local_c8);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_d8);
  }
  else {
    pMVar5 = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator->(&this->policy);
    uVar2 = uStack_28;
    uVar1 = sizeHint_local._6_2_;
    pCVar4 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(&this->inner);
    (*pCVar4->_vptr_ClientHook[4])();
    local_b1 = 1;
    Capability::Client::Client(&local_a0,&local_b0);
    local_b2 = 1;
    (*pMVar5->_vptr_MembranePolicy[1])(local_90,pMVar5,uVar2,(ulong)uVar1,&local_a0);
  }
  if ((local_b2 & 1) != 0) {
    Capability::Client::~Client(&local_a0);
  }
  if ((local_b1 & 1) != 0) {
    kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_b0);
  }
  aVar6 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
           )kj::_::readMaybe<capnp::Capability::Client>
                      ((Maybe<capnp::Capability::Client> *)local_90);
  if (aVar6 == (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
                )0x0) {
    pCVar4 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(&this->inner);
    uVar2 = uStack_28;
    uVar1 = sizeHint_local._6_2_;
    kj::Maybe<capnp::MessageSize>::Maybe(&local_1e0,sizeHint);
    (**pCVar4->_vptr_ClientHook)
              (&local_1c8,pCVar4,uVar2,(ulong)uVar1,&local_1e0,(ulong)(ushort)this_local._6_2_);
    policy = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator*(&this->policy);
    anon_unknown_0::MembraneRequestHook::wrap
              (__return_storage_ptr__,&local_1c8,policy,(bool)(this->reverse & 1));
    Request<capnp::AnyPointer,_capnp::AnyPointer>::~Request(&local_1c8);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_1e0);
    local_160 = 1;
  }
  else {
    _p425.field_1 = aVar6;
    pMVar5 = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator->(&this->policy);
    uVar3 = (*pMVar5->_vptr_MembranePolicy[4])();
    if ((uVar3 & 1) != 0) {
      whenMoreResolved((MembraneHook *)&p);
      other = kj::_::readMaybe<kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>>
                        ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)&p);
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::NullableValue
                ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)
                 local_100,other);
      kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~Maybe
                ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)&p);
      pPVar7 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_100);
      if (pPVar7 != (Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
        pCVar4 = (ClientHook *)
                 kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::
                 operator*((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>
                            *)local_100);
        local_118 = pCVar4;
        addRef((MembraneHook *)local_140);
        kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
        attach<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                  ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)&local_130,
                   (Own<capnp::ClientHook,_std::nullptr_t> *)pCVar4);
        newLocalPromiseClient((capnp *)&local_128,&local_130);
        pCVar4 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(&local_128);
        uVar2 = uStack_28;
        uVar1 = sizeHint_local._6_2_;
        kj::Maybe<capnp::MessageSize>::Maybe(&local_158,sizeHint);
        local_15a = this_local._6_2_;
        (**pCVar4->_vptr_ClientHook)
                  (__return_storage_ptr__,pCVar4,uVar2,(ulong)uVar1,&local_158,
                   (ulong)(ushort)this_local._6_2_);
        kj::Maybe<capnp::MessageSize>::~Maybe(&local_158);
        kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_128);
        kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Promise(&local_130);
        kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)local_140);
      }
      local_160 = (uint)(pPVar7 != (Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0);
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::
      ~NullableValue((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)
                     local_100);
      if (local_160 != 0) goto LAB_004d166a;
    }
    pCVar8 = kj::mv<capnp::Capability::Client>((Client *)_p425.field_1);
    Capability::Client::Client(&local_180,pCVar8);
    ClientHook::from(&local_170,&local_180);
    pCVar4 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                       ((Own<capnp::ClientHook,_std::nullptr_t> *)&local_170);
    uVar2 = uStack_28;
    uVar1 = sizeHint_local._6_2_;
    kj::Maybe<capnp::MessageSize>::Maybe(&local_198,sizeHint);
    local_19a = this_local._6_2_;
    (**pCVar4->_vptr_ClientHook)
              (__return_storage_ptr__,pCVar4,uVar2,(ulong)uVar1,&local_198,
               (ulong)(ushort)this_local._6_2_);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_198);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&local_170);
    Capability::Client::~Client(&local_180);
    local_160 = 1;
  }
LAB_004d166a:
  kj::Maybe<capnp::Capability::Client>::~Maybe((Maybe<capnp::Capability::Client> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
      CallHints hints) override {
    KJ_IF_SOME(r, resolved) {
      return r->newCall(interfaceId, methodId, sizeHint, hints);
    }

    auto redirect = reverse
        ? policy->outboundCall(interfaceId, methodId, Capability::Client(inner->addRef()))
        : policy->inboundCall(interfaceId, methodId, Capability::Client(inner->addRef()));
    KJ_IF_SOME(r, redirect) {
      if (policy->shouldResolveBeforeRedirecting()) {
        // The policy says that *if* this capability points into the membrane, then we want to
        // redirect the call. However, if this capability is a promise, then it could resolve to
        // something outside the membrane later. We have to wait before we actually redirect,
        // otherwise behavior will differ depending on whether the promise is resolved.
        KJ_IF_SOME(p, whenMoreResolved()) {
          return newLocalPromiseClient(p.attach(addRef()))
              ->newCall(interfaceId, methodId, sizeHint, hints);
        }
      }

      return ClientHook::from(kj::mv(r))->newCall(interfaceId, methodId, sizeHint, hints);
    } else {
      // For pass-through calls, we don't worry about promises, because if the capability resolves
      // to something outside the membrane, then the call will pass back out of the membrane too.
      return MembraneRequestHook::wrap(
          inner->newCall(interfaceId, methodId, sizeHint, hints), *policy, reverse);
    }